

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O3

int __thiscall CaDiCaL::Internal::trivially_true_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar2;
  int iVar3;
  pointer ppCVar4;
  Terminator *pTVar5;
  Clause *pCVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  Clause *__range2;
  long lVar10;
  int idx;
  int lit;
  pointer ppCVar11;
  
  ppCVar4 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar11 = (this->clauses).
                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppCVar11 != ppCVar4; ppCVar11 = ppCVar11 + 1) {
    if (this->termination_forced != false) goto LAB_0081b837;
    iVar9 = (this->lim).terminate.forced;
    if ((iVar9 != 0) && ((this->lim).terminate.forced = iVar9 + -1, iVar9 == 1)) goto LAB_0081b830;
    pTVar5 = this->external->terminator;
    if (pTVar5 != (Terminator *)0x0) {
      paVar1 = &(this->lim).terminate;
      iVar9 = paVar1->check;
      paVar1->check = paVar1->check + -1;
      if (iVar9 == 0) {
        (this->lim).terminate.check = (this->opts).terminateint * 100;
        cVar7 = (**(code **)(*(long *)pTVar5 + 0x10))();
        if (cVar7 != '\0') goto LAB_0081b830;
      }
    }
    pCVar6 = *ppCVar11;
    if ((*(ushort *)&pCVar6->field_0x8 & 0x810) == 0) {
      if ((long)pCVar6->size == 0) goto LAB_0081b72b;
      lVar10 = 0;
      while( true ) {
        iVar9 = *(int *)((long)&pCVar6[1].field_0 + lVar10);
        if (('\0' < this->vals[iVar9]) || (-1 < iVar9 && this->vals[iVar9] == '\0')) break;
        lVar10 = lVar10 + 4;
        if ((long)pCVar6->size * 4 == lVar10) goto LAB_0081b72b;
      }
    }
  }
  if (this->internal != (Internal *)0x0) {
    verbose(this->internal,1,"all clauses contain a positive literal");
  }
  iVar9 = *(this->vars).n;
  if (iVar9 != 0) {
    lit = 1;
    do {
      if (this->termination_forced != false) goto LAB_0081b837;
      iVar3 = (this->lim).terminate.forced;
      if ((iVar3 != 0) && ((this->lim).terminate.forced = iVar3 + -1, iVar3 == 1))
      goto LAB_0081b830;
      pTVar5 = this->external->terminator;
      if (pTVar5 != (Terminator *)0x0) {
        paVar1 = &(this->lim).terminate;
        iVar3 = paVar1->check;
        paVar1->check = paVar1->check + -1;
        if (iVar3 == 0) {
          (this->lim).terminate.check = (this->opts).terminateint * 10;
          cVar7 = (**(code **)(*(long *)pTVar5 + 0x10))();
          if (cVar7 != '\0') goto LAB_0081b830;
        }
      }
      if (this->vals[lit] == '\0') {
        search_assume_decision(this,lit);
        bVar8 = propagate(this);
        if (!bVar8) goto LAB_0081b72b;
      }
      bVar8 = lit != iVar9;
      lit = lit + 1;
    } while (bVar8);
  }
  paVar2 = &(this->stats).lucky.constant;
  paVar2->one = paVar2->one + 1;
  return 10;
LAB_0081b72b:
  if (0 < this->level) {
    backtrack(this,0);
  }
  iVar9 = 0;
  goto LAB_0081b84f;
LAB_0081b830:
  this->termination_forced = true;
LAB_0081b837:
  if (0 < this->level) {
    backtrack(this,0);
  }
  iVar9 = -1;
LAB_0081b84f:
  if (this->conflict != (Clause *)0x0) {
    this->conflict = (Clause *)0x0;
  }
  return iVar9;
}

Assistant:

int Internal::trivially_true_satisfiable () {
  LOG ("checking that all clauses contain a positive literal");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (100))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    bool satisfied = false, found_positive_literal = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit < 0)
        continue;
      found_positive_literal = true;
      break;
    }
    if (satisfied || found_positive_literal)
      continue;
    LOG (c, "found purely negatively");
    return unlucky (0);
  }
  VERBOSE (1, "all clauses contain a positive literal");
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    assert (level > 0);
    LOG ("propagation failed including redundant clauses");
    return unlucky (0);
  }
  stats.lucky.constant.one++;
  return 10;
}